

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko
          (ChElementBeamTaperedTimoshenko *this,void **vtt)

{
  undefined1 auVar1 [64];
  ChLoadableU CVar2;
  ChLoadableUVW CVar3;
  _func_int **pp_Var4;
  int iVar5;
  int iVar6;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  assign_op<double,_double> local_81;
  ChMatrixDynamic<> *local_80;
  ChMatrixDynamic<> *local_78;
  ChMatrixDynamic<> *local_70;
  ChMatrixDynamic<> *local_68;
  ChMatrixDynamic<> *local_60;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_58;
  ChKblockGeneric *local_50;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_48;
  
  local_50 = &(this->super_ChElementBeam).super_ChElementGeneric.Kmatr;
  local_60 = &this->Km;
  local_70 = &this->M;
  local_80 = &this->Ri;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8 = ZEXT416(0) << 0x40;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b31918;
  (this->super_ChElementBeam).mass = (double)auVar8._0_8_;
  (this->super_ChElementBeam).length = (double)auVar8._8_8_;
  CVar2 = *(ChLoadableU *)(vtt + 1);
  this->super_ChLoadableU = CVar2;
  *(void **)((long)((ChMatrixDynamic<double> *)(&this->super_ChElementCorotational + -1) + 2) + 0x10
            + *(long *)((long)CVar2 + -0x78)) = vtt[2];
  CVar3 = *(ChLoadableUVW *)(vtt + 3);
  this->super_ChLoadableUVW = CVar3;
  *(void **)((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + *(long *)((long)CVar3 + -0x78) + -0x10) = vtt[4];
  (this->super_ChElementCorotational)._vptr_ChElementCorotational =
       (_func_int **)&PTR__ChElementCorotational_00b319f8;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar8;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  *(undefined1 (*) [16])
   ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar8;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  auVar9 = ZEXT464(0) << 0x40;
  pp_Var4 = (_func_int **)*vtt;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var4;
  this->super_ChLoadableU = *(ChLoadableU *)(vtt + 5);
  *(void **)((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + (long)(pp_Var4[-3] + -0x68)) = vtt[6];
  local_68 = &this->Kg;
  local_78 = &this->Rm;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb31d98;
  this->Kg = (ChMatrixDynamic<>)auVar9._0_24_;
  this->M = (ChMatrixDynamic<>)auVar9._24_24_;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)auVar9._48_8_;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       auVar9._56_8_;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 )auVar9._0_24_;
  this->tapered_section =
       (shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric>)auVar9._24_16_;
  this->Km = (ChMatrixDynamic<>)auVar9._40_24_;
  *(undefined1 (*) [64])
   &(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       auVar9;
  local_58 = &this->nodes;
  auVar7 = vbroadcastf64x4_avx512f(_QUNIT);
  auVar1 = vmovdqu64_avx512f(auVar7);
  this->q_refrotA = (ChQuaternion<double>)auVar1._0_32_;
  this->q_refrotB = (ChQuaternion<double>)auVar1._32_32_;
  auVar1 = vmovdqu64_avx512f(auVar7);
  this->q_element_abs_rot = (ChQuaternion<double>)auVar1._0_32_;
  this->q_element_ref_rot = (ChQuaternion<double>)auVar1._32_32_;
  this->disable_corotate = false;
  this->force_symmetric_stiffness = false;
  this->use_geometric_stiffness = true;
  this->use_Rc = true;
  this->use_Rs = true;
  this->use_simplified_correction_for_inclined_shear_axis = false;
  this->T = (ChMatrixDynamic<>)auVar9._0_24_;
  this->Rc = (ChMatrixDynamic<>)auVar9._24_24_;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)auVar9._48_8_;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       auVar9._56_8_;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(local_58,2);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar5,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar5
             ,(long)iVar6);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->Rs,0x24,6,6);
  local_48.m_rows.m_value =
       (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
  local_48.m_cols.m_value =
       (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
  if (-1 < (local_48.m_cols.m_value | local_48.m_rows.m_value)) {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->Rs,&local_48,&local_81);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&this->Rc,0x24,6,6);
    local_48.m_rows.m_value =
         (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    local_48.m_cols.m_value =
         (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_cols;
    if (-1 < (local_48.m_cols.m_value | local_48.m_rows.m_value)) {
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                (&this->Rc,&local_48,&local_81);
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko()
    : q_refrotA(QUNIT),
      q_refrotB(QUNIT),
      q_element_abs_rot(QUNIT),
      q_element_ref_rot(QUNIT),
      force_symmetric_stiffness(false),
      disable_corotate(false),
      use_geometric_stiffness(true),
      use_Rc(true),
      use_Rs(true) {
    nodes.resize(2);

    Km.setZero(this->GetNdofs(), this->GetNdofs());
    Kg.setZero(this->GetNdofs(), this->GetNdofs());
    M.setZero(this->GetNdofs(), this->GetNdofs());
    Rm.setZero(this->GetNdofs(), this->GetNdofs());
    Ri.setZero(this->GetNdofs(), this->GetNdofs());
    Ki.setZero(this->GetNdofs(), this->GetNdofs());

    T.setZero(this->GetNdofs(), this->GetNdofs());
    Rs.setIdentity(6, 6);
    Rc.setIdentity(6, 6);
}